

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
               (MPI_Datatype *dt,int *k,
               function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *value)

{
  MPI_Datatype poVar1;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this;
  iterator iVar2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar3;
  mapped_type *pmVar4;
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *this_00;
  
  std::mutex::lock((mutex *)attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::
                            mut()::m);
  this = &keymap()->_M_t;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find(this,k);
  pmVar3 = keymap();
  if ((_Rb_tree_header *)iVar2._M_node == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
    pmVar3 = keymap();
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](pmVar3,k);
    *pmVar4 = 0;
    pmVar3 = keymap();
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](pmVar3,k);
    MPI_Type_create_keyval(copy_attr,del_attr,pmVar4,0);
  }
  this_00 = (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)operator_new(0x20);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function(this_00,value);
  poVar1 = *dt;
  pmVar3 = keymap();
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](pmVar3,k);
  MPI_Type_set_attr(poVar1,*pmVar4,this_00);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::mut()::m);
  return;
}

Assistant:

static void set(const MPI_Datatype& dt, const K& k, const T& value) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            // create new keyval with MPI
            keymap()[k] = 0;
            MPI_Type_create_keyval(&attr_map<K,T>::copy_attr,
                                   &attr_map<K,T>::del_attr,
                                   &(keymap()[k]), (void*)NULL);
        }
        // insert new key into keymap
        // set the keyval pair
        T* val = new T(value); // copy construct
        MPI_Type_set_attr(dt, keymap()[k], (void*)val);
    }